

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int decode_one(MMDB_s *mmdb,uint32_t offset,MMDB_entry_data_s *entry_data)

{
  byte bVar1;
  uint8_t *puVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  uint32_t uVar13;
  uint uVar14;
  double dVar15;
  
  uVar4 = mmdb->data_section_size;
  uVar5 = uVar4 - 1;
  if (uVar5 < offset) {
    return 7;
  }
  puVar2 = mmdb->data_section;
  entry_data->offset = offset;
  entry_data->has_data = true;
  uVar10 = offset + 1;
  bVar1 = puVar2[offset];
  if (bVar1 < 0x20) {
    if (uVar5 < uVar10) {
      return 7;
    }
    uVar13 = puVar2[uVar10] + 7;
    uVar10 = offset + 2;
  }
  else {
    uVar13 = (uint32_t)(bVar1 >> 5);
  }
  entry_data->type = uVar13;
  uVar8 = (uint)bVar1;
  if (uVar13 == 1) {
    uVar14 = bVar1 >> 3 & 3;
    uVar5 = uVar14 + 1;
    if (uVar4 - uVar5 < uVar10 || uVar4 < uVar5) {
      return 7;
    }
    switch(uVar14) {
    case 0:
      uVar4 = (uint)puVar2[uVar10] | (uVar8 & 7) << 8;
      break;
    case 1:
      uVar4 = (uint)puVar2[(ulong)uVar10 + 1] + ((uint)puVar2[uVar10] << 8 | (uVar8 & 7) << 0x10) +
              0x800;
      break;
    case 2:
      uVar4 = ((uint)puVar2[(ulong)uVar10 + 2] |
              (uint)puVar2[(ulong)uVar10 + 1] << 8 | (uint)puVar2[uVar10] << 0x10) +
              (uint)(bVar1 & 7) * 0x1000000 + 0x80800;
      break;
    case 3:
      uVar4 = *(uint *)(puVar2 + uVar10);
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    (entry_data->field_1).pointer = uVar4;
    entry_data->data_size = uVar5;
    uVar10 = uVar10 + uVar5;
    goto LAB_00103cbd;
  }
  uVar8 = uVar8 & 0x1f;
  if (uVar8 == 0x1f) {
    if (uVar4 - 3 < uVar10) {
      return 7;
    }
    uVar8 = (uint)puVar2[(ulong)uVar10 + 2] +
            ((uint)puVar2[(ulong)uVar10 + 1] << 8 | (uint)puVar2[uVar10] << 0x10) + 0x1011d;
    uVar10 = uVar10 + 3;
  }
  else if (uVar8 == 0x1e) {
    if (uVar4 - 2 < uVar10) {
      return 7;
    }
    uVar8 = (ushort)(*(ushort *)(puVar2 + uVar10) << 8 | *(ushort *)(puVar2 + uVar10) >> 8) + 0x11d;
    uVar10 = uVar10 + 2;
  }
  else if (uVar8 == 0x1d) {
    if (uVar5 < uVar10) {
      return 7;
    }
    uVar9 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    uVar8 = puVar2[uVar9] + 0x1d;
  }
  if (uVar13 == 7) {
LAB_00103c01:
    entry_data->data_size = uVar8;
    goto LAB_00103cbd;
  }
  if (uVar13 == 0xe) {
    (entry_data->field_1).boolean = uVar8 != 0;
    entry_data->data_size = 0;
    goto LAB_00103cbd;
  }
  if (uVar13 == 0xb) goto LAB_00103c01;
  if (uVar4 - uVar8 < uVar10 || uVar4 < uVar8) {
    return 7;
  }
  switch(uVar13) {
  case 2:
    puVar6 = "";
    if (uVar8 != 0) {
      puVar6 = puVar2 + uVar10;
    }
    (entry_data->field_1).utf8_string = (char *)puVar6;
    goto LAB_00103cd2;
  case 3:
    if (uVar8 != 8) {
      return 7;
    }
    dVar15 = get_ieee754_double(puVar2 + uVar10);
    (entry_data->field_1).double_value = dVar15;
    uVar8 = 8;
    break;
  case 4:
    (entry_data->field_1).utf8_string = (char *)(puVar2 + uVar10);
LAB_00103cd2:
    entry_data->data_size = uVar8;
    break;
  case 5:
    if (2 < uVar8) {
      return 7;
    }
    if (uVar8 == 0) {
      uVar3 = 0;
    }
    else {
      pbVar12 = puVar2 + uVar10;
      iVar11 = uVar8 + 1;
      uVar3 = 0;
      do {
        bVar1 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        uVar3 = (ushort)bVar1 | uVar3 << 8;
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
    }
    (entry_data->field_1).uint16 = uVar3;
    break;
  case 6:
    if (4 < uVar8) {
      return 7;
    }
    if (uVar8 == 0) {
LAB_00103e3c:
      uVar5 = 0;
    }
    else {
      pbVar12 = puVar2 + uVar10;
      iVar11 = uVar8 + 1;
      uVar5 = 0;
      do {
        bVar1 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        uVar5 = (uint)bVar1 | uVar5 << 8;
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
    }
    goto LAB_00103e3e;
  case 8:
    if (4 < uVar8) {
      return 7;
    }
    if (uVar8 == 0) goto LAB_00103e3c;
    pbVar12 = puVar2 + uVar10;
    iVar11 = uVar8 + 1;
    uVar5 = 0;
    do {
      bVar1 = *pbVar12;
      pbVar12 = pbVar12 + 1;
      uVar5 = (uint)bVar1 | uVar5 << 8;
      iVar11 = iVar11 + -1;
    } while (1 < iVar11);
LAB_00103e3e:
    (entry_data->field_1).pointer = uVar5;
    break;
  case 9:
    if (8 < uVar8) {
      return 7;
    }
    if (uVar8 == 0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pbVar12 = puVar2 + uVar10;
      iVar11 = uVar8 + 1;
      pcVar7 = (char *)0x0;
      do {
        bVar1 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        pcVar7 = (char *)((long)pcVar7 << 8 | (ulong)bVar1);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
    }
    goto LAB_00103e4f;
  case 10:
    if (0x10 < uVar8) {
      return 7;
    }
    if (uVar8 == 0) {
      pcVar7 = (char *)0x0;
      uVar9 = 0;
    }
    else {
      pbVar12 = puVar2 + uVar10;
      iVar11 = uVar8 + 1;
      pcVar7 = (char *)0x0;
      uVar9 = 0;
      do {
        uVar9 = uVar9 << 8 | (ulong)pcVar7 >> 0x38;
        bVar1 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        pcVar7 = (char *)((ulong)bVar1 | (long)pcVar7 << 8);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
    }
    *(ulong *)((long)&entry_data->field_1 + 8) = uVar9;
LAB_00103e4f:
    (entry_data->field_1).utf8_string = pcVar7;
    break;
  case 0xf:
    if (uVar8 != 4) {
      return 7;
    }
    (entry_data->field_1).pointer =
         CONCAT31(CONCAT21(CONCAT11(puVar2[uVar10],puVar2[(ulong)uVar10 + 1]),
                           puVar2[(ulong)uVar10 + 2]),puVar2[(ulong)uVar10 + 3]);
    uVar8 = 4;
  }
  uVar10 = uVar10 + uVar8;
LAB_00103cbd:
  entry_data->offset_to_next = uVar10;
  return 0;
}

Assistant:

static int decode_one(const MMDB_s *const mmdb,
                      uint32_t offset,
                      MMDB_entry_data_s *entry_data) {
    const uint8_t *mem = mmdb->data_section;

    // We subtract rather than add as it possible that offset + 1
    // could overflow for a corrupt database while an underflow
    // from data_section_size - 1 should not be possible.
    if (offset > mmdb->data_section_size - 1) {
        DEBUG_MSGF("Offset (%d) past data section (%d)",
                   offset,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    entry_data->offset = offset;
    entry_data->has_data = true;

    DEBUG_NL;
    DEBUG_MSGF("Offset: %i", offset);

    uint8_t ctrl = mem[offset++];
    DEBUG_BINARY("Control byte: %s", ctrl);

    int type = (ctrl >> 5) & 7;
    DEBUG_MSGF("Type: %i (%s)", type, type_num_to_name(type));

    if (type == MMDB_DATA_TYPE_EXTENDED) {
        // Subtracting 1 to avoid possible overflow on offset + 1
        if (offset > mmdb->data_section_size - 1) {
            DEBUG_MSGF("Extended type offset (%d) past data section (%d)",
                       offset,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        type = get_ext_type(mem[offset++]);
        DEBUG_MSGF("Extended type: %i (%s)", type, type_num_to_name(type));
    }

    entry_data->type = (uint32_t)type;

    if (type == MMDB_DATA_TYPE_POINTER) {
        uint8_t psize = ((ctrl >> 3) & 3) + 1;
        DEBUG_MSGF("Pointer size: %i", psize);

        // We check that the offset does not extend past the end of the
        // database and that the subtraction of psize did not underflow.
        if (offset > mmdb->data_section_size - psize ||
            mmdb->data_section_size < psize) {
            DEBUG_MSGF("Pointer offset (%d) past data section (%d)",
                       offset + psize,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->pointer = get_ptr_from(ctrl, &mem[offset], psize);
        DEBUG_MSGF("Pointer to: %i", entry_data->pointer);

        entry_data->data_size = psize;
        entry_data->offset_to_next = offset + psize;
        return MMDB_SUCCESS;
    }

    uint32_t size = ctrl & 31;
    switch (size) {
        case 29:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 1) {
                DEBUG_MSGF("String end (%d, case 29) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 29 + mem[offset++];
            break;
        case 30:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 2) {
                DEBUG_MSGF("String end (%d, case 30) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 285 + get_uint16(&mem[offset]);
            offset += 2;
            break;
        case 31:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 3) {
                DEBUG_MSGF("String end (%d, case 31) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 65821 + get_uint24(&mem[offset]);
            offset += 3;
            break;
        default:
            break;
    }

    DEBUG_MSGF("Size: %i", size);

    if (type == MMDB_DATA_TYPE_MAP || type == MMDB_DATA_TYPE_ARRAY) {
        entry_data->data_size = size;
        entry_data->offset_to_next = offset;
        return MMDB_SUCCESS;
    }

    if (type == MMDB_DATA_TYPE_BOOLEAN) {
        entry_data->boolean = size ? true : false;
        entry_data->data_size = 0;
        entry_data->offset_to_next = offset;
        DEBUG_MSGF("boolean value: %s", entry_data->boolean ? "true" : "false");
        return MMDB_SUCCESS;
    }

    // Check that the data doesn't extend past the end of the memory
    // buffer and that the calculation in doing this did not underflow.
    if (offset > mmdb->data_section_size - size ||
        mmdb->data_section_size < size) {
        DEBUG_MSGF("Data end (%d) past data section (%d)",
                   offset + size,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    if (type == MMDB_DATA_TYPE_UINT16) {
        if (size > 2) {
            DEBUG_MSGF("uint16 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint16 = (uint16_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint16 value: %u", entry_data->uint16);
    } else if (type == MMDB_DATA_TYPE_UINT32) {
        if (size > 4) {
            DEBUG_MSGF("uint32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint32 = (uint32_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint32 value: %u", entry_data->uint32);
    } else if (type == MMDB_DATA_TYPE_INT32) {
        if (size > 4) {
            DEBUG_MSGF("int32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->int32 = get_sintX(&mem[offset], (int)size);
        DEBUG_MSGF("int32 value: %i", entry_data->int32);
    } else if (type == MMDB_DATA_TYPE_UINT64) {
        if (size > 8) {
            DEBUG_MSGF("uint64 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint64 = get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint64 value: %" PRIu64, entry_data->uint64);
    } else if (type == MMDB_DATA_TYPE_UINT128) {
        if (size > 16) {
            DEBUG_MSGF("uint128 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
#if MMDB_UINT128_IS_BYTE_ARRAY
        memset(entry_data->uint128, 0, 16);
        if (size > 0) {
            memcpy(entry_data->uint128 + 16 - size, &mem[offset], size);
        }
#else
        entry_data->uint128 = get_uint128(&mem[offset], (int)size);
#endif
    } else if (type == MMDB_DATA_TYPE_FLOAT) {
        if (size != 4) {
            DEBUG_MSGF("float of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 4;
        entry_data->float_value = get_ieee754_float(&mem[offset]);
        DEBUG_MSGF("float value: %f", entry_data->float_value);
    } else if (type == MMDB_DATA_TYPE_DOUBLE) {
        if (size != 8) {
            DEBUG_MSGF("double of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 8;
        entry_data->double_value = get_ieee754_double(&mem[offset]);
        DEBUG_MSGF("double value: %f", entry_data->double_value);
    } else if (type == MMDB_DATA_TYPE_UTF8_STRING) {
        entry_data->utf8_string = size == 0 ? "" : (char const *)&mem[offset];
        entry_data->data_size = size;
#ifdef MMDB_DEBUG
        char *string =
            mmdb_strndup(entry_data->utf8_string, size > 50 ? 50 : size);
        if (NULL == string) {
            abort();
        }
        DEBUG_MSGF("string value: %s", string);
        free(string);
#endif
    } else if (type == MMDB_DATA_TYPE_BYTES) {
        entry_data->bytes = &mem[offset];
        entry_data->data_size = size;
    }

    entry_data->offset_to_next = offset + size;

    return MMDB_SUCCESS;
}